

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsaStream_HandleXrun(PaAlsaStream *self)

{
  snd_pcm_t *psVar1;
  long lVar2;
  snd_pcm_state_t sVar3;
  int iVar4;
  size_t __n;
  snd_pcm_status_t *__s;
  undefined8 uStack_50;
  size_t local_48;
  size_t __alsa_alloca_size;
  long lStack_38;
  int restartAlsa;
  snd_timestamp_t t;
  PaTime now;
  snd_pcm_status_t *st;
  PaError result;
  PaAlsaStream *self_local;
  
  st._4_4_ = 0;
  uStack_50 = 0x11d5d8;
  t.tv_usec = (__suseconds_t)PaUtil_GetTime();
  __alsa_alloca_size._4_4_ = 0;
  uStack_50 = 0x11d5ed;
  __n = (*(code *)alsa_snd_pcm_status_sizeof)();
  lVar2 = -(__n + 0xf & 0xfffffffffffffff0);
  __s = (snd_pcm_status_t *)((long)&local_48 + lVar2);
  local_48 = __n;
  *(undefined8 *)((long)&uStack_50 + lVar2) = 0x11d619;
  memset(__s,0,__n);
  if ((self->playback).pcm != (snd_pcm_t *)0x0) {
    psVar1 = (self->playback).pcm;
    *(undefined8 *)((long)&uStack_50 + lVar2) = 0x11d643;
    (*alsa_snd_pcm_status)(psVar1,__s);
    *(undefined8 *)((long)&uStack_50 + lVar2) = 0x11d650;
    sVar3 = (*alsa_snd_pcm_status_get_state)(__s);
    if (sVar3 == SND_PCM_STATE_XRUN) {
      *(undefined8 *)((long)&uStack_50 + lVar2) = 0x11d66a;
      (*(code *)alsa_snd_pcm_status_get_trigger_tstamp)(__s,&stack0xffffffffffffffc8);
      self->underrun =
           (double)t.tv_usec * 1000.0 + -((double)lStack_38 * 1000.0 + (double)t.tv_sec / 1000.0);
      if ((self->playback).canMmap == 0) {
        psVar1 = (self->playback).pcm;
        *(undefined8 *)((long)&uStack_50 + lVar2) = 0x11d6f2;
        iVar4 = (*alsa_snd_pcm_recover)(psVar1,-0x20,0);
        if (iVar4 < 0) {
          __alsa_alloca_size._4_4_ = __alsa_alloca_size._4_4_ + 1;
        }
      }
      else {
        __alsa_alloca_size._4_4_ = __alsa_alloca_size._4_4_ + 1;
      }
    }
  }
  if ((self->capture).pcm != (snd_pcm_t *)0x0) {
    psVar1 = (self->capture).pcm;
    *(undefined8 *)((long)&uStack_50 + lVar2) = 0x11d739;
    (*alsa_snd_pcm_status)(psVar1,__s);
    *(undefined8 *)((long)&uStack_50 + lVar2) = 0x11d746;
    sVar3 = (*alsa_snd_pcm_status_get_state)(__s);
    if (sVar3 == SND_PCM_STATE_XRUN) {
      *(undefined8 *)((long)&uStack_50 + lVar2) = 0x11d760;
      (*(code *)alsa_snd_pcm_status_get_trigger_tstamp)(__s,&stack0xffffffffffffffc8);
      self->overrun =
           (double)t.tv_usec * 1000.0 + -((double)lStack_38 * 1000.0 + (double)t.tv_sec / 1000.0);
      if ((self->capture).canMmap == 0) {
        psVar1 = (self->capture).pcm;
        *(undefined8 *)((long)&uStack_50 + lVar2) = 0x11d7e8;
        iVar4 = (*alsa_snd_pcm_recover)(psVar1,-0x20,0);
        if (iVar4 < 0) {
          __alsa_alloca_size._4_4_ = __alsa_alloca_size._4_4_ + 1;
        }
      }
      else {
        __alsa_alloca_size._4_4_ = __alsa_alloca_size._4_4_ + 1;
      }
    }
  }
  if (__alsa_alloca_size._4_4_ != 0) {
    *(undefined8 *)((long)&uStack_50 + lVar2) = 0x11d816;
    paUtilErr_ = AlsaRestart(self);
    if (paUtilErr_ < 0) {
      *(undefined8 *)((long)&uStack_50 + lVar2) = 0x11d83d;
      PaUtil_DebugPrint(
                       "Expression \'AlsaRestart( self )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3308\n"
                       );
      st._4_4_ = paUtilErr_;
    }
  }
  return st._4_4_;
}

Assistant:

static PaError PaAlsaStream_HandleXrun( PaAlsaStream *self )
{
    PaError result = paNoError;
    snd_pcm_status_t *st;
    PaTime now = PaUtil_GetTime();
    snd_timestamp_t t;
    int restartAlsa = 0; /* do not restart Alsa by default */

    alsa_snd_pcm_status_alloca( &st );

    if( self->playback.pcm )
    {
        alsa_snd_pcm_status( self->playback.pcm, st );
        if( alsa_snd_pcm_status_get_state( st ) == SND_PCM_STATE_XRUN )
        {
            alsa_snd_pcm_status_get_trigger_tstamp( st, &t );
            self->underrun = now * 1000 - ( (PaTime)t.tv_sec * 1000 + (PaTime)t.tv_usec / 1000 );

            if( !self->playback.canMmap )
            {
                if( alsa_snd_pcm_recover( self->playback.pcm, -EPIPE, 0 ) < 0 )
                {
                    PA_DEBUG(( "%s: [playback] non-MMAP-PCM failed recovering from XRUN, will restart Alsa\n", __FUNCTION__ ));
                    ++ restartAlsa; /* did not manage to recover */
                }
            }
            else
                ++ restartAlsa; /* always restart MMAPed device */
        }
    }
    if( self->capture.pcm )
    {
        alsa_snd_pcm_status( self->capture.pcm, st );
        if( alsa_snd_pcm_status_get_state( st ) == SND_PCM_STATE_XRUN )
        {
            alsa_snd_pcm_status_get_trigger_tstamp( st, &t );
            self->overrun = now * 1000 - ((PaTime) t.tv_sec * 1000 + (PaTime) t.tv_usec / 1000);

            if (!self->capture.canMmap)
            {
                if (alsa_snd_pcm_recover( self->capture.pcm, -EPIPE, 0 ) < 0)
                {
                    PA_DEBUG(( "%s: [capture] non-MMAP-PCM failed recovering from XRUN, will restart Alsa\n", __FUNCTION__ ));
                    ++ restartAlsa; /* did not manage to recover */
                }
            }
            else
                ++ restartAlsa; /* always restart MMAPed device */
        }
    }

    if( restartAlsa )
    {
        PA_DEBUG(( "%s: restarting Alsa to recover from XRUN\n", __FUNCTION__ ));
        PA_ENSURE( AlsaRestart( self ) );
    }

end:
    return result;
error:
    goto end;
}